

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRPluginManager.cpp
# Opt level: O0

void __thiscall MinVR::VRPluginManager::~VRPluginManager(VRPluginManager *this)

{
  size_type sVar1;
  reference ppVVar2;
  reference ppVVar3;
  undefined8 *in_RDI;
  size_t f_1;
  size_t f;
  value_type in_stack_ffffffffffffffd0;
  ulong local_18;
  ulong local_10;
  
  *in_RDI = &PTR__VRPluginManager_001bc910;
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>::size
                      ((vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_> *)(in_RDI + 2)
                      );
    if (sVar1 <= local_10) break;
    ppVVar2 = std::vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>::operator[]
                        ((vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_> *)
                         (in_RDI + 2),local_10);
    (**(code **)(*(long *)*ppVVar2 + 0x18))(*ppVVar2,in_RDI[1]);
    ppVVar2 = std::vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>::operator[]
                        ((vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_> *)
                         (in_RDI + 2),local_10);
    in_stack_ffffffffffffffd0 = *ppVVar2;
    if (in_stack_ffffffffffffffd0 != (value_type)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0 + 8))();
    }
    local_10 = local_10 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>::size
                      ((vector<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                        *)(in_RDI + 5));
    if (sVar1 <= local_18) break;
    ppVVar3 = std::vector<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>::
              operator[]((vector<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                          *)(in_RDI + 5),local_18);
    if (*ppVVar3 != (value_type)0x0) {
      (*(*ppVVar3)->_vptr_VRSharedLibrary[1])();
    }
    local_18 = local_18 + 1;
  }
  std::vector<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>::~vector
            ((vector<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>::~vector
            ((vector<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_> *)
             in_stack_ffffffffffffffd0);
  return;
}

Assistant:

VRPluginManager::~VRPluginManager() {
	for (size_t f = 0; f < _plugins.size(); f++)
	{
		_plugins[f]->unregisterWithMinVR(_vrMain);
		delete _plugins[f];
	}

	for (size_t f = 0; f < _libraries.size(); f++)
	{
		delete _libraries[f];
	}
}